

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederate.cpp
# Opt level: O2

Publication * __thiscall
helics::ValueFederate::getPublication(ValueFederate *this,string_view name,int index1)

{
  ValueFederateManager *this_00;
  Publication *pPVar1;
  string_view key;
  allocator<char> local_a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  string_view name_local;
  
  name_local._M_str = name._M_str;
  name_local._M_len = name._M_len;
  this_00 = (this->vfManager)._M_t.
            super___uniq_ptr_impl<helics::ValueFederateManager,_std::default_delete<helics::ValueFederateManager>_>
            ._M_t.
            super__Tuple_impl<0UL,_helics::ValueFederateManager_*,_std::default_delete<helics::ValueFederateManager>_>
            .super__Head_base<0UL,_helics::ValueFederateManager_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&local_48,&name_local,&local_a9);
  std::operator+(&local_68,&local_48,'_');
  CLI::std::__cxx11::to_string(&local_88,index1);
  std::operator+(&local_a8,&local_68,&local_88);
  key._M_str = local_a8._M_dataplus._M_p;
  key._M_len = local_a8._M_string_length;
  pPVar1 = ValueFederateManager::getPublication(this_00,key);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  return pPVar1;
}

Assistant:

const Publication& ValueFederate::getPublication(std::string_view name, int index1) const
{
    return vfManager->getPublication(std::string(name) + '_' + std::to_string(index1));
}